

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layout.h
# Opt level: O0

void __thiscall
Iir::LayoutBase::addPoleZeroConjugatePairs(LayoutBase *this,complex_t *pole,complex_t *zero)

{
  complex_t v;
  complex_t v_00;
  bool bVar1;
  complex_t *in_RDX;
  PoleZeroPair *in_RSI;
  complex_t *in_RDI;
  complex_t *p1;
  PoleZeroPair *this_00;
  PoleZeroPair *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  
  if ((*(uint *)in_RDI->_M_value & 1) != 0) {
    throw_invalid_argument((char *)in_RDI);
  }
  v._M_value._8_8_ = in_stack_ffffffffffffff50;
  v._M_value._0_8_ = in_stack_ffffffffffffff48;
  bVar1 = is_nan<std::complex<double>>(v);
  if (bVar1) {
    throw_invalid_argument((char *)in_RDI);
  }
  this_00 = *(PoleZeroPair **)(in_RDX->_M_value + 8);
  v_00._M_value._8_8_ = in_stack_ffffffffffffff50;
  v_00._M_value._0_8_ = in_stack_ffffffffffffff48;
  bVar1 = is_nan<std::complex<double>>(v_00);
  if (bVar1) {
    throw_invalid_argument((char *)in_RDI);
  }
  std::conj<double>((complex<double> *)in_RSI);
  std::conj<double>((complex<double> *)in_RSI);
  PoleZeroPair::PoleZeroPair(this_00,p1,in_RDI,in_RDX,(complex_t *)in_RSI);
  PoleZeroPair::operator=(in_RSI,in_stack_ffffffffffffff48);
  *(int *)in_RDI->_M_value = *(int *)in_RDI->_M_value + 2;
  return;
}

Assistant:

void addPoleZeroConjugatePairs (const complex_t& pole,
						const complex_t& zero)
		{
			if (m_numPoles&1)
				throw_invalid_argument(errCantAdd2ndOrder);
			if (Iir::is_nan(pole))
				throw_invalid_argument(errPoleisNaN);
			if (Iir::is_nan(zero))
				throw_invalid_argument(errZeroisNaN);
			m_pair[m_numPoles/2] = PoleZeroPair (
				pole, zero, std::conj (pole), std::conj (zero));
			m_numPoles += 2;
		}